

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Screen.cpp
# Opt level: O0

bool __thiscall Screen::displayText(Screen *this,string *text)

{
  uint uVar1;
  WINDOW *pWVar2;
  ulong uVar3;
  size_type sVar4;
  undefined8 uVar5;
  value_type local_70 [48];
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textFragments;
  int i;
  string *text_local;
  Screen *this_local;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_40);
  if ((this->animationMode & 1U) == 0) {
    updateInfo(this);
    clearWindow(this,this->textScreen);
    uVar3 = std::__cxx11::string::length();
    if ((uint)this->textMaxLength < uVar3) {
      this->currPosition = 0;
      while (uVar1 = this->currPosition, uVar3 = std::__cxx11::string::length(), uVar1 < uVar3) {
        std::__cxx11::string::substr((ulong)local_70,(ulong)text);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_40,local_70);
        std::__cxx11::string::~string((string *)local_70);
        this->currPosition = this->textMaxLength + this->currPosition;
      }
      textFragments.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = this->currentFragment;
      while (uVar3 = (ulong)textFragments.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
            sVar4 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_40), uVar3 < sVar4) {
        wclear(this->textScreen);
        pWVar2 = this->textScreen;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_40,
                     (long)(int)textFragments.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
        uVar5 = std::__cxx11::string::c_str();
        wprintw(pWVar2,uVar5);
        wrefresh(this->textScreen);
        uVar3 = (ulong)textFragments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        sVar4 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_40);
        if (uVar3 == sVar4 - 1) {
          this->currentFragment = 0;
          refreshInput(this);
        }
        else {
          indicateMoreText(this);
        }
        textFragments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             textFragments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        this->currentFragment = this->currentFragment + 1;
      }
    }
    else {
      std::__cxx11::string::operator=((string *)&this->currentText,(string *)text);
      pWVar2 = this->textScreen;
      uVar5 = std::__cxx11::string::c_str();
      wprintw(pWVar2,uVar5);
      wrefresh(this->textScreen);
    }
  }
  else {
    pWVar2 = this->animationScreen;
    uVar5 = std::__cxx11::string::c_str();
    wprintw(pWVar2,uVar5);
    wrefresh(this->animationScreen);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return true;
}

Assistant:

bool Screen::displayText(std::string text) {
    int i;
    std::vector<std::string> textFragments;

    if(!animationMode){
        // Update the info area
        updateInfo();

        // Remove any unwanted text
        clearWindow(textScreen);

        // Print the message
        if (text.length() > (unsigned int)textMaxLength){
            currPosition = 0;
            while((unsigned int)currPosition < text.length()){
                textFragments.push_back(text.substr((unsigned long)currPosition, (unsigned long)(currPosition + textMaxLength)));
                currPosition += textMaxLength;
            }

            for(i = currentFragment; (unsigned int)i < textFragments.size(); i++, currentFragment++){
                wclear(textScreen);
                wprintw(textScreen, textFragments[i].c_str());
                wrefresh(textScreen);

                // Reset the counter
                if((unsigned int)i == textFragments.size() - 1){
                    currentFragment = 0;
                    refreshInput();
                    continue;
                }
                else {
                    indicateMoreText();
                }
            }
        }
        else {
            currentText = text;
            wprintw(textScreen, currentText.c_str());

            // Display the message
            wrefresh(textScreen);
        }



        return true;
    }
    else{
        // Print the message
        wprintw(animationScreen, text.c_str());

        // Display the message
        wrefresh(animationScreen);

        return true;
    }
}